

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int unqlite_kv_fetch_callback
              (unqlite *pDb,void *pKey,int nKeyLen,_func_int_void_ptr_uint_void_ptr *xConsumer,
              void *pUserData)

{
  unqlite_kv_methods *puVar1;
  unqlite_kv_cursor *puVar2;
  unqlite_kv_engine *puVar3;
  int local_54;
  int rc;
  unqlite_kv_cursor *pCur;
  unqlite_kv_engine *pEngine;
  unqlite_kv_methods *pMethods;
  void *pUserData_local;
  _func_int_void_ptr_uint_void_ptr *xConsumer_local;
  int nKeyLen_local;
  void *pKey_local;
  unqlite *pDb_local;
  
  if ((pDb == (unqlite *)0x0) || (pDb->nMagic != 0xdb7c2712)) {
    pDb_local._4_4_ = -0x18;
  }
  else {
    puVar3 = unqlitePagerGetKvEngine(pDb);
    puVar1 = puVar3->pIo->pMethods;
    puVar2 = (pDb->sDB).pCursor;
    xConsumer_local._4_4_ = nKeyLen;
    if (nKeyLen < 0) {
      xConsumer_local._4_4_ = SyStrlen((char *)pKey);
    }
    if (xConsumer_local._4_4_ == 0) {
      unqliteGenError(pDb,"Empty key");
      local_54 = -3;
    }
    else {
      local_54 = (*puVar1->xSeek)(puVar2,pKey,xConsumer_local._4_4_,1);
    }
    if ((local_54 == 0) && (xConsumer != (_func_int_void_ptr_uint_void_ptr *)0x0)) {
      local_54 = (*puVar1->xData)(puVar2,xConsumer,pUserData);
    }
    pDb_local._4_4_ = local_54;
  }
  return pDb_local._4_4_;
}

Assistant:

int unqlite_kv_fetch_callback(unqlite *pDb,const void *pKey,int nKeyLen,int (*xConsumer)(const void *,unsigned int,void *),void *pUserData)
{
	unqlite_kv_methods *pMethods;
	unqlite_kv_engine *pEngine;
	unqlite_kv_cursor *pCur;
	int rc;
	if( UNQLITE_DB_MISUSE(pDb) ){
		return UNQLITE_CORRUPT;
	}
#if defined(UNQLITE_ENABLE_THREADS)
	 /* Acquire DB mutex */
	 SyMutexEnter(sUnqlMPGlobal.pMutexMethods, pDb->pMutex); /* NO-OP if sUnqlMPGlobal.nThreadingLevel != UNQLITE_THREAD_LEVEL_MULTI */
	 if( sUnqlMPGlobal.nThreadingLevel > UNQLITE_THREAD_LEVEL_SINGLE && 
		 UNQLITE_THRD_DB_RELEASE(pDb) ){
			 return UNQLITE_ABORT; /* Another thread have released this instance */
	 }
#endif
	 /* Point to the underlying storage engine */
	 pEngine = unqlitePagerGetKvEngine(pDb);
	 pMethods = pEngine->pIo->pMethods;
	 pCur = pDb->sDB.pCursor;
	 if( nKeyLen < 0 ){
		 /* Assume a null terminated string and compute it's length */
		 nKeyLen = SyStrlen((const char *)pKey);
	 }
	 if( !nKeyLen ){
		 unqliteGenError(pDb,"Empty key");
		 rc = UNQLITE_EMPTY;
	 }else{
		 /* Seek to the record position */
		 rc = pMethods->xSeek(pCur,pKey,nKeyLen,UNQLITE_CURSOR_MATCH_EXACT);
	 }
	 if( rc == UNQLITE_OK && xConsumer ){
		 /* Consume the data directly */
		 rc = pMethods->xData(pCur,xConsumer,pUserData);	 
	 }
#if defined(UNQLITE_ENABLE_THREADS)
	 /* Leave DB mutex */
	 SyMutexLeave(sUnqlMPGlobal.pMutexMethods,pDb->pMutex); /* NO-OP if sUnqlMPGlobal.nThreadingLevel != UNQLITE_THREAD_LEVEL_MULTI */
#endif
	return rc;
}